

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_timer.c
# Opt level: O0

mfb_timer * mfb_timer_create(void)

{
  mfb_timer *pmVar1;
  mfb_timer *tmr;
  
  if (mfb_timer_create::once != 0) {
    mfb_timer_create::once = 0;
    mfb_timer_init();
  }
  pmVar1 = (mfb_timer *)malloc(0x18);
  mfb_timer_reset((mfb_timer *)0x105a00);
  return pmVar1;
}

Assistant:

struct mfb_timer *
mfb_timer_create() {
    static int  once = 1;
    mfb_timer   *tmr;

    if(once) {
        once = 0;
        mfb_timer_init();
    }

    tmr = malloc(sizeof(mfb_timer));
    mfb_timer_reset(tmr);

    return tmr;
}